

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_string(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            string_view_type *sv,semantic_tag tag,ser_context *param_3,error_code *ec)

{
  size_t *psVar1;
  pointer psVar2;
  bool bVar3;
  uint64_t *puVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  undefined7 in_register_00000011;
  long nanoseconds;
  uint64_t uVar8;
  type tVar9;
  bigint q;
  bigint rem;
  int64_t seconds;
  basic_bigint<std::allocator<unsigned_char>_> bStack_d8;
  basic_bigint<std::allocator<unsigned_char>_> local_b0;
  basic_bigint<std::allocator<unsigned_char>_> local_88;
  basic_bigint<std::allocator<unsigned_char>_> local_60;
  basic_bigint<std::allocator<unsigned_char>_> local_38;
  
  iVar7 = (int)CONCAT71(in_register_00000011,tag);
  if (iVar7 == 7) {
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&local_88,sv->_M_str,sv->_M_len)
    ;
    bVar3 = operator!=(&local_88,0);
    if (!bVar3) {
      write_timestamp(this,0,0);
      goto LAB_00536d9f;
    }
    bStack_d8.field_0._0_1_ = bStack_d8.field_0._0_1_ & 0xfc;
    bStack_d8.field_0.common_stor_.length_ = 0;
    bStack_d8.field_0.short_stor_.values_[0] = 0;
    bStack_d8.field_0.short_stor_.values_[1] = 0;
    local_b0.field_0._0_1_ = local_b0.field_0._0_1_ & 0xfc;
    local_b0.field_0.common_stor_.length_ = 0;
    local_b0.field_0.short_stor_.values_[0] = 0;
    local_60.field_0._0_1_ = local_60.field_0._0_1_ & 0xfc;
    local_b0.field_0.short_stor_.values_[1] = 0;
    local_60.field_0.common_stor_.length_ = 1;
    local_60.field_0.short_stor_.values_[0] = 1000000000;
    local_60.field_0.short_stor_.values_[1] = 0;
    basic_bigint<std::allocator<unsigned_char>_>::divide
              (&local_88,&local_60,&bStack_d8,&local_b0,true);
    if (((local_60.field_0._0_1_ & 1) != 0) &&
       ((pointer)local_60.field_0.short_stor_.values_[1] != (pointer)0x0)) {
      operator_delete(local_60.field_0.dynamic_stor_.data_,
                      local_60.field_0.short_stor_.values_[0] << 3);
    }
    if (bStack_d8.field_0.common_stor_.length_ == 0) {
      uVar5 = 0;
    }
    else {
      puVar4 = basic_bigint<std::allocator<unsigned_char>_>::data(&bStack_d8);
      uVar5 = *puVar4;
    }
    uVar8 = -uVar5;
    if ((bStack_d8.field_0._0_1_ & 2) == 0) {
      uVar8 = uVar5;
    }
    if (local_b0.field_0.common_stor_.length_ == 0) {
      uVar5 = 0;
    }
    else {
      puVar4 = basic_bigint<std::allocator<unsigned_char>_>::data(&local_b0);
      uVar5 = *puVar4;
    }
    uVar6 = -uVar5;
    if (0 < (long)uVar5) {
      uVar6 = uVar5;
    }
    write_timestamp(this,uVar8,uVar6);
  }
  else {
    if (iVar7 != 6) {
      if (iVar7 != 5) {
        write_string_value(this,sv);
        psVar2 = (this->stack_).
                 super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->stack_).
            super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
            ._M_impl.super__Vector_impl_data._M_start == psVar2) {
          return true;
        }
        psVar1 = &psVar2[-1].index_;
        *psVar1 = *psVar1 + 1;
        return true;
      }
      tVar9 = detail::to_integer<long,char>(sv->_M_str,sv->_M_len,(long *)&local_88);
      if (tVar9.ec != success) {
        std::error_code::operator=(ec,invalid_timestamp);
        return true;
      }
      write_timestamp(this,local_88._0_8_,0);
      return true;
    }
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&local_88,sv->_M_str,sv->_M_len)
    ;
    bVar3 = operator!=(&local_88,0);
    if (!bVar3) {
      write_timestamp(this,0,0);
      goto LAB_00536d9f;
    }
    bStack_d8.field_0._0_1_ = bStack_d8.field_0._0_1_ & 0xfc;
    bStack_d8.field_0.common_stor_.length_ = 0;
    bStack_d8.field_0.short_stor_.values_[0] = 0;
    bStack_d8.field_0.short_stor_.values_[1] = 0;
    local_b0.field_0._0_1_ = local_b0.field_0._0_1_ & 0xfc;
    local_b0.field_0.common_stor_.length_ = 0;
    local_b0.field_0.short_stor_.values_[0] = 0;
    local_38.field_0._0_1_ = local_38.field_0._0_1_ & 0xfc;
    local_b0.field_0.short_stor_.values_[1] = 0;
    local_38.field_0.common_stor_.length_ = 1;
    local_38.field_0.short_stor_.values_[0] = 1000;
    local_38.field_0.short_stor_.values_[1] = 0;
    basic_bigint<std::allocator<unsigned_char>_>::divide
              (&local_88,&local_38,&bStack_d8,&local_b0,true);
    if (((local_38.field_0._0_1_ & 1) != 0) &&
       ((pointer)local_38.field_0.short_stor_.values_[1] != (pointer)0x0)) {
      operator_delete(local_38.field_0.dynamic_stor_.data_,
                      local_38.field_0.short_stor_.values_[0] << 3);
    }
    if (bStack_d8.field_0.common_stor_.length_ == 0) {
      uVar5 = 0;
    }
    else {
      puVar4 = basic_bigint<std::allocator<unsigned_char>_>::data(&bStack_d8);
      uVar5 = *puVar4;
    }
    uVar8 = -uVar5;
    if ((bStack_d8.field_0._0_1_ & 2) == 0) {
      uVar8 = uVar5;
    }
    if (local_b0.field_0.common_stor_.length_ == 0) {
      uVar5 = 0;
    }
    else {
      puVar4 = basic_bigint<std::allocator<unsigned_char>_>::data(&local_b0);
      uVar5 = *puVar4;
    }
    uVar6 = -uVar5;
    if ((local_b0.field_0._0_1_ & 2) == 0) {
      uVar6 = uVar5;
    }
    nanoseconds = uVar6 * -1000000;
    if (-1 < (long)uVar6) {
      nanoseconds = uVar6 * 1000000;
    }
    write_timestamp(this,uVar8,nanoseconds);
  }
  if (((local_b0.field_0._0_1_ & 1) != 0) &&
     ((pointer)local_b0.field_0.short_stor_.values_[1] != (pointer)0x0)) {
    operator_delete(local_b0.field_0.dynamic_stor_.data_,
                    local_b0.field_0.short_stor_.values_[0] << 3);
  }
  if (((bStack_d8.field_0._0_1_ & 1) != 0) &&
     ((pointer)bStack_d8.field_0.short_stor_.values_[1] != (pointer)0x0)) {
    operator_delete(bStack_d8.field_0.dynamic_stor_.data_,
                    bStack_d8.field_0.short_stor_.values_[0] << 3);
  }
LAB_00536d9f:
  if (((local_88.field_0._0_1_ & 1) != 0) &&
     ((pointer)local_88.field_0.short_stor_.values_[1] != (pointer)0x0)) {
    operator_delete(local_88.field_0.dynamic_stor_.data_,
                    local_88.field_0.short_stor_.values_[0] << 3);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code& ec) final
        {
            switch (tag)
            {
                case semantic_tag::epoch_second:
                {
                    int64_t seconds;
                    auto result = jsoncons::detail::to_integer(sv.data(), sv.length(), seconds);
                    if (!result)
                    {
                        ec = msgpack_errc::invalid_timestamp;
                        JSONCONS_VISITOR_RETURN;
                    }
                    write_timestamp(seconds, 0);
                    break;
                }
                case semantic_tag::epoch_milli:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    if (n != 0)
                    {
                        bigint q;
                        bigint rem;
                        n.divide(millis_in_second, q, rem, true);
                        auto seconds = static_cast<int64_t>(q);
                        auto nanoseconds = static_cast<int64_t>(rem) * nanos_in_milli;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                case semantic_tag::epoch_nano:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    if (n != 0)
                    {
                        bigint q;
                        bigint rem;
                        n.divide(nanos_in_second, q, rem, true);
                        auto seconds = static_cast<int64_t>(q);
                        auto nanoseconds = static_cast<int64_t>(rem);
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                default:
                {
                    write_string_value(sv);
                    end_value();
                    break;
                }
            }
            JSONCONS_VISITOR_RETURN;
        }